

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gba.h
# Opt level: O2

uint ClownLZSS::Internal::Gba::ReadHeader<std::ifstream>
               (DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_> *input)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  
  DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
  ::ReadImplementation
            (&input->
              super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
            );
  uVar1 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::ReadImplementation
                    (&input->
                      super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    );
  uVar2 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::ReadImplementation
                    (&input->
                      super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    );
  uVar3 = DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
          ::ReadImplementation
                    (&input->
                      super_DecompressorInputBase<std::basic_ifstream<char,_std::char_traits<char>_>,_ClownLZSS::DecompressorInput<std::basic_ifstream<char,_std::char_traits<char>_>_>_>
                    );
  return (uint)CONCAT12(uVar3,CONCAT11(uVar2,uVar1));
}

Assistant:

unsigned int ReadHeader(DecompressorInput<T> &input)
			{
				input.Read(); // Skip compression type byte
				return input.Read() + (input.Read() << 8) + (input.Read() << 16);
			}